

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O1

double __thiscall
VarianceSwapsHestonAnalyticalPricer::price
          (VarianceSwapsHestonAnalyticalPricer *this,VarianceSwap *varianceSwap)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  vector<double,_std::allocator<double>_> dates;
  vector<double,_std::allocator<double>_> local_28;
  
  VarianceSwap::getDates(&local_28,varianceSwap);
  dVar2 = u1Term(this,*local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                 local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1]);
  dVar2 = dVar2 + 0.0;
  if (0x10 < (ulong)((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start)) {
    uVar1 = 2;
    do {
      dVar3 = uiTerm(this,local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar1 - 1],
                     local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar1]);
      dVar2 = dVar2 + dVar3;
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)local_28.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_28.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  dVar3 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (dVar2 * 10000.0) / dVar3;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::price(const VarianceSwap& varianceSwap) const{
    double price=0;
    std::vector<double> dates = varianceSwap.getDates();

    price = price + u1Term(dates[0],dates[1]);
    for (std::size_t i = 2; i < dates.size(); i++)
    {   
        // std::cout << uiTerm(dates[i-1],dates[i]) << std::endl;
        price = price + uiTerm(dates[i-1],dates[i]);
    }
    price = price * 10000. / dates.back();
    return price;
}